

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

size_t center_NAs(size_t *ix_arr,size_t st_left,size_t st,size_t curr_pos)

{
  size_t sVar1;
  size_t row;
  size_t temp;
  size_t curr_pos_local;
  size_t st_local;
  size_t st_left_local;
  size_t *ix_arr_local;
  
  curr_pos_local = curr_pos;
  for (row = st_left; row < st; row = row + 1) {
    sVar1 = ix_arr[curr_pos_local - 1];
    ix_arr[curr_pos_local - 1] = ix_arr[row];
    ix_arr[row] = sVar1;
    curr_pos_local = curr_pos_local - 1;
  }
  return curr_pos_local;
}

Assistant:

size_t center_NAs(size_t ix_arr[], size_t st_left, size_t st, size_t curr_pos)
{
    size_t temp;
    for (size_t row = st_left; row < st; row++)
    {
        temp = ix_arr[--curr_pos];
        ix_arr[curr_pos] = ix_arr[row];
        ix_arr[row] = temp;
    }

    return curr_pos;
}